

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfault.h
# Opt level: O0

string * logfault::Handler::LevelName_abi_cxx11_(LogLevel level)

{
  int iVar1;
  const_reference pvVar2;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
  *local_18;
  LogLevel local_c;
  LogLevel level_local;
  
  local_c = level;
  if (LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    if (iVar1 != 0) {
      local_18 = &LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,"DISABLED",
                 &local_19);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x143488;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0x20,
                 "ERROR",local_2d);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x1434a8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0x40,
                 "WARNING",&local_2e);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x1434c8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0x60,
                 "NOTICE",&local_2f);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x1434e8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0x80,
                 "INFO",&local_30);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x143508;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0xa0,
                 "DEBUGGING",&local_31);
      local_18 = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                  *)0x143528;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_.field_0xc0,
                 "TRACE",&local_32);
      std::allocator<char>::~allocator((allocator<char> *)&local_32);
      std::allocator<char>::~allocator((allocator<char> *)&local_31);
      std::allocator<char>::~allocator((allocator<char> *)&local_30);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
      std::allocator<char>::~allocator((allocator<char> *)&local_19);
      __cxa_atexit(std::
                   array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
                   ::~array,&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_);
    }
  }
  pvVar2 = std::
           array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
           ::at(&LevelName[abi:cxx11](logfault::LogLevel)::names_abi_cxx11_,(long)(int)local_c);
  return pvVar2;
}

Assistant:

static const std::string& LevelName(const LogLevel level) {
            static const std::array<std::string, 7> names =
                {{"DISABLED", "ERROR", "WARNING", "NOTICE", "INFO", "DEBUGGING", "TRACE"}};
            return names.at(static_cast<size_t>(level));
        }